

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::~LogFile(LogFile *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unique_ptr<AppendFile,_std::default_delete<AppendFile>_> *unaff_retaddr;
  
  std::unique_ptr<AppendFile,_std::default_delete<AppendFile>_>::~unique_ptr(unaff_retaddr);
  std::unique_ptr<MutexLock,_std::default_delete<MutexLock>_>::~unique_ptr
            ((unique_ptr<MutexLock,_std::default_delete<MutexLock>_> *)in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

LogFile::~LogFile() { }